

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdsmf.c
# Opt level: O3

DUH * dumb_read_riff_dsmf(DUMBFILE *f,riff *stream)

{
  uint uVar1;
  riff_chunk *prVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  char cVar5;
  uchar uVar6;
  int iVar7;
  DUMB_IT_SIGDATA *sigdata_00;
  uchar *puVar8;
  IT_PATTERN *pIVar9;
  IT_SAMPLE *pIVar10;
  DUH *pDVar11;
  uchar uVar12;
  int iVar13;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *local_68;
  DUMB_IT_SIGDATA *local_60;
  char *local_58;
  DUMB_IT_SIGDATA *local_50;
  char *local_48;
  char *local_40;
  
  local_68 = &_dumb_sigtype_it;
  if (((stream != (riff *)0x0) && (stream->type == 0x44534d46)) &&
     (sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138), sigdata_00 != (DUMB_IT_SIGDATA *)0x0)) {
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    uVar17 = (ulong)stream->chunk_count;
    if (uVar17 != 0) {
      prVar2 = stream->chunks;
      iVar13 = 0;
      iVar7 = 0;
      uVar14 = 0;
      bVar3 = false;
      do {
        puVar15 = &prVar2[uVar14].size;
        while( true ) {
          uVar14 = uVar14 + 1;
          uVar1 = ((riff_chunk *)(puVar15 + -2))->type;
          if (uVar1 != 0x534f4e47) break;
          if ((bVar3) || (*puVar15 < 0xc0)) goto LAB_00711f3a;
          puVar15 = puVar15 + 6;
          bVar3 = true;
          if (uVar14 == uVar17) goto LAB_00711aae;
        }
        if (uVar1 == 0x494e5354) {
          iVar7 = iVar7 + 1;
          sigdata_00->n_samples = iVar7;
        }
        else if (uVar1 == 0x50415454) {
          iVar13 = iVar13 + 1;
          sigdata_00->n_patterns = iVar13;
        }
      } while (uVar14 != uVar17);
      if (bVar3) {
LAB_00711aae:
        if (((iVar7 != 0) && (iVar13 < 0x100)) && ((iVar13 != 0 && (iVar7 < 0x100)))) {
          sigdata_00->song_message = (uchar *)0x0;
          sigdata_00->n_orders = 0;
          sigdata_00->n_instruments = 0;
          sigdata_00->order = (uchar *)0x0;
          sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
          sigdata_00->sample = (IT_SAMPLE *)0x0;
          sigdata_00->pattern = (IT_PATTERN *)0x0;
          sigdata_00->midi = (IT_MIDI *)0x0;
          sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
          sigdata_00->mixing_volume = 0x30;
          sigdata_00->pan_separation = 0x80;
          sigdata_00->restart_position = '\0';
          builtin_memcpy(sigdata_00->channel_volume,
                         "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
          cVar5 = (char)(uint)((ulong)((long)(dumb_it_default_panning_separation << 5) * 0x51eb851f)
                              >> 0x25) - (char)((dumb_it_default_panning_separation << 5) >> 0x1f);
          uVar12 = ' ' - cVar5;
          uVar6 = cVar5 + ' ';
          uVar14 = 0xfffffffffffffffc;
          do {
            sigdata_00->channel_pan[uVar14 + 4] = uVar12;
            sigdata_00->channel_pan[uVar14 + 5] = uVar6;
            sigdata_00->channel_pan[uVar14 + 6] = uVar6;
            sigdata_00->channel_pan[uVar14 + 7] = uVar12;
            uVar14 = uVar14 + 4;
          } while (uVar14 < 0x3c);
          uVar14 = 0;
          do {
            if (stream->chunks[uVar14].type == 0x534f4e47) {
              iVar7 = dumbfile_seek(f,(long)stream->chunks[uVar14].offset,0);
              if (iVar7 != 0) goto LAB_00711f53;
              dumbfile_getnc((char *)sigdata_00,0x1c,f);
              sigdata_00->name[0x1c] = '\0';
              sigdata_00->flags = 0x31;
              dumbfile_skip(f,8);
              iVar7 = dumbfile_igetw(f);
              sigdata_00->n_orders = iVar7;
              dumbfile_skip(f,4);
              iVar7 = dumbfile_igetw(f);
              sigdata_00->n_pchannels = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->global_volume = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->mixing_volume = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->speed = iVar7;
              iVar7 = dumbfile_getc(f);
              sigdata_00->tempo = iVar7;
              lVar16 = 0;
              do {
                iVar7 = dumbfile_getc(f);
                sigdata_00->channel_pan[lVar16] = (uchar)((uint)(iVar7 - (iVar7 >> 0x1f)) >> 1);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0x10);
              puVar8 = (uchar *)malloc(0x80);
              sigdata_00->order = puVar8;
              if (puVar8 == (uchar *)0x0) goto LAB_00711f53;
              dumbfile_getnc((char *)puVar8,0x80,f);
              uVar17 = (ulong)stream->chunk_count;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < uVar17);
          iVar7 = sigdata_00->n_patterns;
          pIVar9 = (IT_PATTERN *)malloc((long)iVar7 << 4);
          sigdata_00->pattern = pIVar9;
          auVar4 = _DAT_0073b300;
          if (pIVar9 != (IT_PATTERN *)0x0) {
            if (0 < iVar7) {
              lVar16 = (long)iVar7 + -1;
              auVar18._8_4_ = (int)lVar16;
              auVar18._0_8_ = lVar16;
              auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
              lVar16 = 0;
              auVar18 = auVar18 ^ _DAT_0073b300;
              auVar22 = _DAT_0073b2f0;
              do {
                auVar21 = auVar22 ^ auVar4;
                if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                            auVar18._4_4_ < auVar21._4_4_) & 1)) {
                  *(undefined8 *)((long)&pIVar9->entry + lVar16) = 0;
                }
                if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
                    auVar21._12_4_ <= auVar18._12_4_) {
                  *(undefined8 *)((long)&pIVar9[1].entry + lVar16) = 0;
                }
                lVar20 = auVar22._8_8_;
                auVar22._0_8_ = auVar22._0_8_ + 2;
                auVar22._8_8_ = lVar20 + 2;
                lVar16 = lVar16 + 0x20;
              } while ((ulong)(iVar7 + 1U >> 1) << 5 != lVar16);
            }
            iVar7 = sigdata_00->n_samples;
            pIVar10 = (IT_SAMPLE *)malloc((long)iVar7 * 0x68);
            sigdata_00->sample = pIVar10;
            auVar4 = _DAT_0073b300;
            if (pIVar10 != (IT_SAMPLE *)0x0) {
              if (0 < iVar7) {
                lVar16 = (long)iVar7 + -1;
                auVar19._8_4_ = (int)lVar16;
                auVar19._0_8_ = lVar16;
                auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
                lVar16 = 0;
                auVar19 = auVar19 ^ _DAT_0073b300;
                auVar21 = _DAT_0073b2f0;
                do {
                  auVar22 = auVar21 ^ auVar4;
                  if ((bool)(~(auVar22._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar22._0_4_ ||
                              auVar19._4_4_ < auVar22._4_4_) & 1)) {
                    puVar8 = pIVar10->filename + lVar16 + 0x35;
                    puVar8[0] = '\0';
                    puVar8[1] = '\0';
                    puVar8[2] = '\0';
                    puVar8[3] = '\0';
                    puVar8[4] = '\0';
                    puVar8[5] = '\0';
                    puVar8[6] = '\0';
                    puVar8[7] = '\0';
                  }
                  if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
                      auVar22._12_4_ <= auVar19._12_4_) {
                    puVar8 = pIVar10[1].filename + lVar16 + 0x35;
                    puVar8[0] = '\0';
                    puVar8[1] = '\0';
                    puVar8[2] = '\0';
                    puVar8[3] = '\0';
                    puVar8[4] = '\0';
                    puVar8[5] = '\0';
                    puVar8[6] = '\0';
                    puVar8[7] = '\0';
                  }
                  lVar20 = auVar21._8_8_;
                  auVar21._0_8_ = auVar21._0_8_ + 2;
                  auVar21._8_8_ = lVar20 + 2;
                  lVar16 = lVar16 + 0xd0;
                } while ((ulong)(iVar7 + 1U >> 1) * 0xd0 - lVar16 != 0);
              }
              sigdata_00->n_samples = 0;
              sigdata_00->n_patterns = 0;
              if ((int)uVar17 != 0) {
                lVar16 = 8;
                uVar17 = 0;
                do {
                  prVar2 = stream->chunks;
                  iVar7 = *(int *)((long)prVar2 + lVar16 + -8);
                  if (iVar7 == 0x494e5354) {
                    iVar7 = dumbfile_seek(f,(long)*(int *)((long)prVar2 + lVar16 + -4),0);
                    if ((iVar7 != 0) ||
                       (iVar7 = it_riff_dsmf_process_sample
                                          (sigdata_00->sample + sigdata_00->n_samples,f,
                                           *(int *)((long)&prVar2->type + lVar16)), iVar7 != 0))
                    goto LAB_00711f53;
                    sigdata_00->n_samples = sigdata_00->n_samples + 1;
                  }
                  else if (iVar7 == 0x50415454) {
                    iVar7 = dumbfile_seek(f,(long)*(int *)((long)prVar2 + lVar16 + -4),0);
                    if ((iVar7 != 0) ||
                       (iVar7 = it_riff_dsmf_process_pattern
                                          (sigdata_00->pattern + sigdata_00->n_patterns,f,
                                           *(int *)((long)&prVar2->type + lVar16)), iVar7 != 0))
                    goto LAB_00711f53;
                    sigdata_00->n_patterns = sigdata_00->n_patterns + 1;
                  }
                  uVar17 = uVar17 + 1;
                  lVar16 = lVar16 + 0x18;
                } while (uVar17 < stream->chunk_count);
              }
              _dumb_it_fix_invalid_orders(sigdata_00);
              local_58 = "TITLE";
              local_48 = "FORMAT";
              local_40 = "RIFF DSMF";
              local_60 = sigdata_00;
              local_50 = sigdata_00;
              pDVar11 = make_duh(-1,2,(char *(*) [2])&local_58,1,&local_68,&local_60);
              return pDVar11;
            }
          }
LAB_00711f53:
          _dumb_it_unload_sigdata(sigdata_00);
          return (DUH *)0x0;
        }
      }
    }
LAB_00711f3a:
    free(sigdata_00);
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_dsmf( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_dsmf_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF DSMF";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}